

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O0

void __thiscall r_exec::HLPBindingMap::reset_bwd_timings(HLPBindingMap *this,_Fact *reference_fact)

{
  uint16_t uVar1;
  StructureValue *pSVar2;
  reference pvVar3;
  _Fact *reference_fact_local;
  HLPBindingMap *this_local;
  
  pSVar2 = (StructureValue *)operator_new(0x20);
  (*(reference_fact->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
    super_Code.super__Object._vptr__Object[4])(reference_fact,2);
  uVar1 = r_code::Atom::asIndex();
  StructureValue::StructureValue(pSVar2,&this->super_BindingMap,(Code *)reference_fact,uVar1);
  pvVar3 = std::vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>::operator[]
                     (&(this->super_BindingMap).map,
                      (long)*(short *)&(this->super_BindingMap).field_0x36);
  core::P<r_exec::Value>::operator=(pvVar3,(Value *)pSVar2);
  pSVar2 = (StructureValue *)operator_new(0x20);
  (*(reference_fact->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
    super_Code.super__Object._vptr__Object[4])(reference_fact,3);
  uVar1 = r_code::Atom::asIndex();
  StructureValue::StructureValue(pSVar2,&this->super_BindingMap,(Code *)reference_fact,uVar1);
  pvVar3 = std::vector<core::P<r_exec::Value>,_std::allocator<core::P<r_exec::Value>_>_>::operator[]
                     (&(this->super_BindingMap).map,(long)this->bwd_before_index);
  core::P<r_exec::Value>::operator=(pvVar3,(Value *)pSVar2);
  return;
}

Assistant:

void HLPBindingMap::reset_bwd_timings(_Fact *reference_fact)   // valuate at after_index and after_index+1 from the timings of the reference fact.
{
    map[bwd_after_index] = new StructureValue(this, reference_fact, reference_fact->code(FACT_AFTER).asIndex());
    map[bwd_before_index] = new StructureValue(this, reference_fact, reference_fact->code(FACT_BEFORE).asIndex());
}